

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.cpp
# Opt level: O1

ostream * operator<<(ostream *output,LinkedList *list)

{
  Node *pNVar1;
  ostream *poVar2;
  
  for (pNVar1 = list->start; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)output,pNVar1->index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"> ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(pNVar1->data)._M_dataplus._M_p,(pNVar1->data)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return output;
}

Assistant:

std::ostream &operator<<(std::ostream &output, LinkedList &list) {

    Node* node = list.start;

    // Print line number followed by the node's string data and end the line
    while (node != nullptr) {
        output << node->index << "> " << node->data << std::endl;

        node = node->next;
    }
    return output;  // chain them together like strings
}